

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

int arg_parse(int argc,char **argv,void **argtable)

{
  char cVar1;
  byte bVar2;
  code *pcVar3;
  arg_end *endtable;
  byte *pbVar4;
  void *pvVar5;
  long lVar6;
  char **nargv;
  size_t sVar7;
  char *pcVar8;
  int *__ptr;
  size_t sVar9;
  char *pcVar10;
  byte *pbVar11;
  int *piVar12;
  int *piVar13;
  void **ppvVar15;
  char *pcVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  bool bVar20;
  undefined4 *puVar21;
  long lVar22;
  void *pvVar23;
  arg_hdr **table;
  arg_hdr *hdr;
  long lVar24;
  int *piVar14;
  
  ppvVar15 = argtable;
  do {
    pcVar3 = *(code **)((long)*ppvVar15 + 0x38);
    if (pcVar3 != (code *)0x0) {
      (*pcVar3)(*(undefined8 *)((long)*ppvVar15 + 0x30));
    }
    pbVar11 = (byte *)*ppvVar15;
    ppvVar15 = ppvVar15 + 1;
  } while ((*pbVar11 & 1) == 0);
  lVar6 = -0x100000000;
  ppvVar15 = argtable;
  do {
    lVar6 = lVar6 + 0x100000000;
    pbVar11 = (byte *)*ppvVar15;
    ppvVar15 = ppvVar15 + 1;
  } while ((*pbVar11 & 1) == 0);
  endtable = *(arg_end **)((long)argtable + (lVar6 >> 0x1d));
  if (argc == 0) {
    arg_parse_check((arg_hdr **)argtable,endtable);
  }
  else {
    nargv = (char **)malloc((long)argc * 8 + 8);
    if (nargv == (char **)0x0) {
      arg_register_error(endtable,endtable,2,(char *)0x0);
    }
    else {
      if (0 < argc) {
        memcpy(nargv,argv,(ulong)(uint)argc << 3);
      }
      nargv[argc] = (char *)0x0;
      iVar18 = 1;
      lVar6 = 0;
      lVar24 = 0;
      do {
        pbVar11 = (byte *)argtable[lVar6];
        pcVar8 = *(char **)(pbVar11 + 0x10);
        if (pcVar8 == (char *)0x0) {
          lVar22 = 1;
        }
        else {
          sVar7 = strlen(pcVar8);
          lVar22 = sVar7 + 1;
          do {
            iVar18 = iVar18 + 1;
            pcVar8 = strchr(pcVar8 + 1,0x2c);
          } while (pcVar8 != (char *)0x0);
        }
        lVar24 = lVar24 + lVar22;
        lVar6 = lVar6 + 1;
      } while ((*pbVar11 & 1) == 0);
      __ptr = (int *)malloc(lVar24 + (long)iVar18 * 0x20 + 0x10);
      if (__ptr != (int *)0x0) {
        *__ptr = 0;
        __ptr[1] = iVar18;
        *(int **)(__ptr + 2) = __ptr + 4;
        pbVar11 = (byte *)*argtable;
        if ((*pbVar11 & 1) == 0) {
          piVar12 = __ptr + 4 + (long)iVar18 * 8;
          lVar6 = 0;
          lVar24 = 0;
          do {
            pcVar8 = *(char **)(pbVar11 + 0x10);
            if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
              lVar24 = (long)(int)lVar24;
              piVar13 = piVar12;
              piVar14 = piVar12;
              do {
                while( true ) {
                  piVar12 = (int *)((long)piVar13 + 1);
                  cVar1 = *pcVar8;
                  if ((cVar1 == '\0') || (cVar1 == ',')) break;
                  pcVar8 = pcVar8 + 1;
                  *(char *)piVar13 = cVar1;
                  piVar13 = piVar12;
                }
                *(char *)piVar13 = '\0';
                cVar1 = *pcVar8;
                lVar22 = *(long *)(__ptr + 2);
                lVar17 = lVar24 * 0x20;
                *(int **)(lVar22 + lVar17) = piVar14;
                *(int **)(lVar22 + 0x10 + lVar17) = __ptr;
                *(int *)(lVar22 + 0x18 + lVar17) = (int)lVar6;
                if ((*argtable[lVar6] & 4) == 0) {
                  puVar21 = (undefined4 *)(lVar22 + lVar17 + 8);
                  if ((*argtable[lVar6] & 2) == 0) {
                    *puVar21 = 0;
                  }
                  else {
                    *puVar21 = 1;
                  }
                }
                else {
                  *(undefined4 *)(lVar22 + 8 + lVar17) = 2;
                }
                pcVar8 = pcVar8 + (cVar1 == ',');
                lVar24 = lVar24 + 1;
                piVar13 = piVar12;
                piVar14 = piVar12;
              } while (*pcVar8 != '\0');
            }
            pbVar11 = (byte *)argtable[lVar6 + 1];
            lVar6 = lVar6 + 1;
          } while ((*pbVar11 & 1) == 0);
          lVar6 = (long)(int)lVar24;
        }
        else {
          lVar6 = 0;
        }
        lVar24 = *(long *)(__ptr + 2);
        lVar6 = lVar6 * 0x20;
        *(undefined8 *)(lVar24 + lVar6) = 0;
        *(undefined4 *)(lVar24 + 8 + lVar6) = 0;
        *(undefined8 *)(lVar24 + 0x10 + lVar6) = 0;
        *(undefined4 *)(lVar24 + 0x18 + lVar6) = 0;
      }
      pbVar11 = (byte *)*argtable;
      sVar7 = 2;
      bVar2 = *pbVar11;
      pbVar4 = pbVar11;
      ppvVar15 = argtable;
      while ((bVar2 & 1) == 0) {
        ppvVar15 = ppvVar15 + 1;
        if (*(char **)(pbVar4 + 8) == (char *)0x0) {
          lVar6 = 0;
        }
        else {
          sVar9 = strlen(*(char **)(pbVar4 + 8));
          lVar6 = sVar9 * 3;
        }
        sVar7 = sVar7 + lVar6;
        pbVar4 = (byte *)*ppvVar15;
        bVar2 = *pbVar4;
      }
      pcVar8 = (char *)malloc(sVar7);
      if (pcVar8 != (char *)0x0) {
        pcVar10 = pcVar8 + 1;
        *pcVar8 = ':';
        if ((*pbVar11 & 1) == 0) {
          lVar6 = 0;
          do {
            pcVar16 = *(char **)(pbVar11 + 8);
            if (pcVar16 != (char *)0x0) {
              cVar1 = *pcVar16;
              while (cVar1 != '\0') {
                pcVar16 = pcVar16 + 1;
                *pcVar10 = cVar1;
                if ((*pbVar11 & 2) == 0) {
                  pcVar10 = pcVar10 + 1;
                }
                else {
                  pcVar10[1] = ':';
                  pcVar10 = pcVar10 + 2;
                }
                if ((*pbVar11 & 4) != 0) {
                  *pcVar10 = ':';
                  pcVar10 = pcVar10 + 1;
                }
                cVar1 = *pcVar16;
              }
            }
            pbVar11 = (byte *)argtable[lVar6 + 1];
            lVar6 = lVar6 + 1;
          } while ((*pbVar11 & 1) == 0);
        }
        *pcVar10 = '\0';
      }
      if ((__ptr != (int *)0x0) && (pcVar8 != (char *)0x0)) {
        optind = 0;
        opterr = 0;
LAB_001071a3:
        while (iVar18 = getopt_internal(argc,nargv,pcVar8,*(option **)(__ptr + 2),(int *)0x0,1),
              0x39 < iVar18) {
          if (iVar18 == 0x3a) {
            arg_register_error(endtable,endtable,5,nargv[(long)optind + -1]);
          }
          else {
            if (iVar18 != 0x3f) goto LAB_001072ac;
            if (optopt == 0) {
              arg_register_error(endtable,endtable,4,nargv[(long)optind + -1]);
            }
            else {
              arg_register_error(endtable,endtable,optopt,(char *)0x0);
            }
          }
        }
        if (iVar18 == 0) {
          iVar18 = *__ptr;
          pvVar23 = *(void **)((long)argtable[iVar18] + 0x30);
          if (((optarg != (char *)0x0) && (*optarg == '\0')) && ((*argtable[iVar18] & 2) != 0)) {
            arg_register_error(endtable,endtable,5,nargv[(long)optind + -1]);
          }
          if (*(code **)((long)argtable[iVar18] + 0x40) == (code *)0x0) goto LAB_001071a3;
          iVar18 = (**(code **)((long)argtable[iVar18] + 0x40))(pvVar23,optarg);
        }
        else {
          if (iVar18 == -1) goto LAB_00107398;
LAB_001072ac:
          pbVar11 = (byte *)*argtable;
          iVar19 = -1;
          if ((*pbVar11 & 1) == 0) {
            lVar6 = 0;
            do {
              if ((*(char **)(pbVar11 + 8) != (char *)0x0) &&
                 (pcVar10 = strchr(*(char **)(pbVar11 + 8),(int)(char)iVar18),
                 pcVar10 != (char *)0x0)) {
                iVar19 = (int)lVar6;
                break;
              }
              pbVar11 = (byte *)argtable[lVar6 + 1];
              lVar6 = lVar6 + 1;
              iVar19 = -1;
            } while ((*pbVar11 & 1) == 0);
          }
          if (iVar19 == -1) {
            arg_register_error(endtable,endtable,iVar18,(char *)0x0);
            goto LAB_001071a3;
          }
          pcVar3 = *(code **)((long)argtable[iVar19] + 0x40);
          if (pcVar3 == (code *)0x0) goto LAB_001071a3;
          pvVar23 = *(void **)((long)argtable[iVar19] + 0x30);
          iVar18 = (*pcVar3)(pvVar23,optarg);
        }
        if (iVar18 != 0) {
          arg_register_error(endtable,pvVar23,iVar18,optarg);
        }
        goto LAB_001071a3;
      }
      arg_register_error(endtable,endtable,2,(char *)0x0);
LAB_00107398:
      free(pcVar8);
      free(__ptr);
      pbVar11 = (byte *)*argtable;
      if ((*pbVar11 & 1) == 0) {
        iVar19 = 0;
        iVar18 = 0;
        pvVar23 = (void *)0x0;
        pcVar8 = (char *)0x0;
        do {
          bVar20 = true;
          if (optind < argc) {
            if (((*(long *)(pbVar11 + 0x10) == 0) && (*(long *)(pbVar11 + 8) == 0)) &&
               (*(code **)(pbVar11 + 0x40) != (code *)0x0)) {
              pvVar5 = *(void **)(pbVar11 + 0x30);
              iVar18 = (**(code **)(pbVar11 + 0x40))(pvVar5,nargv[optind]);
              if (iVar18 == 0) {
                optind = optind + 1;
                iVar18 = 0;
                bVar20 = false;
              }
              else {
                iVar19 = iVar19 + 1;
                pcVar8 = nargv[optind];
                bVar20 = false;
                pvVar23 = pvVar5;
              }
            }
            else {
              iVar19 = iVar19 + 1;
              bVar20 = false;
            }
          }
          if (bVar20) goto LAB_0010748e;
          pbVar11 = (byte *)argtable[iVar19];
        } while ((*pbVar11 & 1) == 0);
      }
      else {
        pcVar8 = (char *)0x0;
        pvVar23 = (void *)0x0;
        iVar18 = 0;
      }
      if (iVar18 != 0) {
        arg_register_error(endtable,pvVar23,iVar18,pcVar8);
        optind = optind + 1;
      }
      while (optind < argc) {
        lVar6 = (long)optind;
        optind = optind + 1;
        arg_register_error(endtable,endtable,3,nargv[lVar6]);
      }
LAB_0010748e:
      if (endtable->count == 0) {
        arg_parse_check((arg_hdr **)argtable,endtable);
      }
      free(nargv);
    }
  }
  return endtable->count;
}

Assistant:

int arg_parse(int argc, char * *argv, void * *argtable) {
	struct arg_hdr * *table = (struct arg_hdr * *)argtable;
	struct arg_end * endtable;
	int endindex;
	char * *argvcopy = NULL;

	/*printf("arg_parse(%d,%p,%p)\n",argc,argv,argtable);*/

	/* reset any argtable data from previous invocations */
	arg_reset(argtable);

	/* locate the first end-of-table marker within the array */
	endindex = arg_endindex(table);
	endtable = (struct arg_end *)table[endindex];

	/* Special case of argc==0.  This can occur on Texas Instruments DSP. */
	/* Failure to trap this case results in an unwanted NULL result from  */
	/* the malloc for argvcopy (next code block).                         */
	if (argc == 0) {
		/* We must still perform post-parse checks despite the absence of command line arguments */
		arg_parse_check(table, endtable);

		/* Now we are finished */
		return endtable->count;
	}

	argvcopy = (char **)malloc(sizeof(char *) * (argc + 1));

	if (argvcopy) {
		int i;

		/*
		   Fill in the local copy of argv[]. We need a local copy
		   because getopt rearranges argv[] which adversely affects
		   susbsequent parsing attempts.
		 */
		for (i = 0; i < argc; i++) {
			argvcopy[i] = argv[i];
		}

		argvcopy[argc] = NULL;

		/* parse the command line (local copy) for tagged options */
		arg_parse_tagged(argc, argvcopy, table, endtable);

		/* parse the command line (local copy) for untagged options */
		arg_parse_untagged(argc, argvcopy, table, endtable);

		/* if no errors so far then perform post-parse checks otherwise dont bother */
		if (endtable->count == 0) {
			arg_parse_check(table, endtable);
		}

		/* release the local copt of argv[] */
		free(argvcopy);
	} else {
		/* memory alloc failed */
		arg_register_error(endtable, endtable, ARG_EMALLOC, NULL);
	}

	return endtable->count;
}